

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

uint32 rw::d3d8::getSizeNativeTexture(Texture *tex)

{
  int32 iVar1;
  int32 iVar2;
  int32 local_1c;
  int32 i;
  int32 levels;
  uint32 size;
  Texture *tex_local;
  
  i = 100;
  iVar1 = Raster::getNumLevels(tex->raster);
  if ((tex->raster->format & 0x4000U) == 0) {
    if ((tex->raster->format & 0x2000U) != 0) {
      i = 0x464;
    }
  }
  else {
    i = 0xe4;
  }
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    iVar2 = d3d::getLevelSize(tex->raster,local_1c);
    i = iVar2 + 4 + i;
  }
  return i;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 16;
	int32 levels = tex->raster->getNumLevels();
	if(tex->raster->format & Raster::PAL4)
		size += 4*32;
	else if(tex->raster->format & Raster::PAL8)
		size += 4*256;
	for(int32 i = 0; i < levels; i++)
		size += 4 + getLevelSize(tex->raster, i);
	return size;
}